

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetSpan(Parse *pParse,ExprList *pList,char *zStart,char *zEnd)

{
  sqlite3 *db_00;
  char *pcVar1;
  int iVar2;
  ExprList_item *pItem;
  sqlite3 *db;
  char *zEnd_local;
  char *zStart_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pList != (ExprList *)0x0) {
    iVar2 = pList->nExpr + -1;
    sqlite3DbFree(db_00,pList->a[iVar2].zSpan);
    pcVar1 = sqlite3DbSpanDup(db_00,zStart,zEnd);
    pList->a[iVar2].zSpan = pcVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSpan(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  const char *zStart,     /* Start of the span */
  const char *zEnd        /* End of the span */
){
  sqlite3 *db = pParse->db;
  assert( pList!=0 || db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr-1];
    assert( pList->nExpr>0 );
    sqlite3DbFree(db, pItem->zSpan);
    pItem->zSpan = sqlite3DbSpanDup(db, zStart, zEnd);
  }
}